

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O3

bool __thiscall
ot::commissioner::security_material::SecurityMaterials::IsEmpty(SecurityMaterials *this,bool isCCM)

{
  undefined3 in_register_00000031;
  bool bVar1;
  
  if (CONCAT31(in_register_00000031,isCCM) == 0) {
    bVar1 = (this->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (this->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  }
  else {
    if ((((this->mCertificate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (this->mCertificate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start) ||
        ((this->mPrivateKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish !=
         (this->mPrivateKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start)) ||
       ((this->mTrustAnchor).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->mTrustAnchor).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start)) {
      return false;
    }
    bVar1 = (this->mCommissionerToken).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (this->mCommissionerToken).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  }
  return bVar1;
}

Assistant:

bool SecurityMaterials::IsEmpty(bool isCCM) const
{
    return isCCM ? mCertificate.size() == 0 && mPrivateKey.size() == 0 && mTrustAnchor.size() == 0 &&
                       mCommissionerToken.size() == 0
                 : mPSKc.size() == 0;
}